

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StructColumnData::GetUpdateStatistics(StructColumnData *this)

{
  type other;
  reference this_00;
  pointer pCVar1;
  long in_RSI;
  ulong __n;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
  validity_stats;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> child_stats;
  BaseStatistics stats;
  undefined1 local_c0 [56];
  BaseStatistics local_88;
  
  local_c0._16_8_ = this;
  LogicalType::LogicalType((LogicalType *)(local_c0 + 0x20),(LogicalType *)(in_RSI + 0x30));
  BaseStatistics::CreateEmpty(&local_88,(LogicalType *)(local_c0 + 0x20));
  LogicalType::~LogicalType((LogicalType *)(local_c0 + 0x20));
  ColumnData::GetUpdateStatistics((ColumnData *)local_c0);
  if ((_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)local_c0._0_8_ !=
      (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0) {
    other = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
            operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                       *)local_c0);
    BaseStatistics::Merge(&local_88,other);
  }
  for (__n = 0; __n < (ulong)(*(long *)(in_RSI + 0x118) - *(long *)(in_RSI + 0x110) >> 3);
      __n = __n + 1) {
    this_00 = vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
                           *)(in_RSI + 0x110),__n);
    pCVar1 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(this_00);
    (*pCVar1->_vptr_ColumnData[0x19])
              ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
               (local_c0 + 8),pCVar1);
    if ((BlockManager *)local_c0._8_8_ != (BlockManager *)0x0) {
      local_c0._24_8_ = local_c0._8_8_;
      local_c0._8_8_ = (BlockManager *)0x0;
      StructStats::SetChildStats
                (&local_88,__n,
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)(local_c0 + 0x18));
      ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   *)(local_c0 + 0x18));
    }
    ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
    ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
                (local_c0 + 8));
  }
  BaseStatistics::ToUnique((BaseStatistics *)local_c0._16_8_);
  ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
              local_c0);
  BaseStatistics::~BaseStatistics(&local_88);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         local_c0._16_8_;
}

Assistant:

unique_ptr<BaseStatistics> StructColumnData::GetUpdateStatistics() {
	// check if any child column has updates
	auto stats = BaseStatistics::CreateEmpty(type);
	auto validity_stats = validity.GetUpdateStatistics();
	if (validity_stats) {
		stats.Merge(*validity_stats);
	}
	for (idx_t i = 0; i < sub_columns.size(); i++) {
		auto child_stats = sub_columns[i]->GetUpdateStatistics();
		if (child_stats) {
			StructStats::SetChildStats(stats, i, std::move(child_stats));
		}
	}
	return stats.ToUnique();
}